

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::SendMessage
          (V2TransportTester *this,string *mtype,Span<const_unsigned_char> payload)

{
  size_t __n;
  long in_FS_OFFSET;
  Span<const_unsigned_char> content;
  vector<unsigned_char,_std::allocator<unsigned_char>_> contents;
  allocator_type local_41;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  long local_28;
  
  __n = payload.m_size;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,__n + 0xd,&local_41)
  ;
  if (mtype->_M_string_length != 0) {
    memmove(local_40._M_impl.super__Vector_impl_data._M_start + 1,(mtype->_M_dataplus)._M_p,
            mtype->_M_string_length);
  }
  if (__n != 0) {
    memmove(local_40._M_impl.super__Vector_impl_data._M_start + 0xd,payload.m_data,__n);
  }
  content.m_size =
       (long)local_40._M_impl.super__Vector_impl_data._M_finish -
       (long)local_40._M_impl.super__Vector_impl_data._M_start;
  content.m_data = local_40._M_impl.super__Vector_impl_data._M_start;
  SendPacket(this,content,(Span<const_unsigned_char>)ZEXT816(0),false);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SendMessage(std::string mtype, Span<const uint8_t> payload)
    {
        // Construct contents consisting of 0x00 + 12-byte message type + payload.
        std::vector<uint8_t> contents(1 + CMessageHeader::COMMAND_SIZE + payload.size());
        std::copy(mtype.begin(), mtype.end(), reinterpret_cast<char*>(contents.data() + 1));
        std::copy(payload.begin(), payload.end(), contents.begin() + 1 + CMessageHeader::COMMAND_SIZE);
        // Send a packet with that as contents.
        SendPacket(contents);
    }